

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a28a9::BNTest_SmallPrime_Test::~BNTest_SmallPrime_Test
          (BNTest_SmallPrime_Test *this)

{
  BNTest::~BNTest(&this->super_BNTest);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(BNTest, SmallPrime) {
  static const unsigned kBits = 10;

  bssl::UniquePtr<BIGNUM> r(BN_new());
  ASSERT_TRUE(r);
  ASSERT_TRUE(BN_generate_prime_ex(r.get(), static_cast<int>(kBits), 0, NULL,
                                   NULL, NULL));
  EXPECT_EQ(kBits, BN_num_bits(r.get()));
}